

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseDecoder.cpp
# Opt level: O0

GrowingAlignedDataBuffer * __thiscall
siamese::DecoderPacketWindow::GetSum
          (DecoderPacketWindow *this,uint laneIndex,uint sumIndex,uint elementEnd)

{
  bool bVar1;
  uint in_ECX;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  uint8_t CX;
  uint originalBytes;
  OriginalPacket *original;
  uint element;
  DecoderSum *sum;
  LogStringBuffer buffer;
  undefined4 in_stack_fffffffffffff948;
  uint in_stack_fffffffffffff94c;
  Allocator *in_stack_fffffffffffff950;
  LogStringBuffer *in_stack_fffffffffffff958;
  LogStringBuffer *buffer_00;
  LogStringBuffer *this_00;
  byte local_651;
  uint local_650;
  uint local_64c;
  reference local_648;
  uint local_63c;
  long local_638;
  uint local_62c;
  uint local_628;
  uint local_624 [3];
  GrowingAlignedDataBuffer *local_618;
  uint local_60c;
  uint local_5fc;
  long local_5f8;
  uint local_5f0;
  char local_5e9;
  byte *local_5e8;
  char *local_5e0;
  uint *local_5d8;
  char *local_5d0;
  uint *local_5c8;
  char *local_5c0;
  uint *local_5b8;
  char *local_5b0;
  undefined8 *local_5a8;
  byte *local_5a0;
  char *local_598;
  uint *local_590;
  char *local_588;
  uint *local_580;
  char *local_578;
  uint *local_570;
  char *local_568;
  undefined4 local_55c;
  undefined8 *local_558;
  undefined4 local_54c;
  undefined8 *local_548;
  ostream aoStack_520 [124];
  int in_stack_fffffffffffffb5c;
  void *in_stack_fffffffffffffb60;
  void *in_stack_fffffffffffffb68;
  char *in_stack_fffffffffffffd40;
  char *pcVar2;
  uint *in_stack_fffffffffffffd48;
  uint *puVar3;
  char *in_stack_fffffffffffffd50;
  char *pcVar4;
  uint *in_stack_fffffffffffffd58;
  uint *puVar5;
  
  local_638 = in_RDI + 0x118 + (ulong)in_ESI * 0x48 + (ulong)in_EDX * 0x18;
  local_63c = *(uint *)(local_638 + 4);
  local_62c = in_ECX;
  local_628 = in_EDX;
  if (local_63c < in_ECX) {
    do {
      local_60c = local_63c;
      local_5f8 = in_RDI + 0x38;
      local_5fc = local_63c >> 6;
      local_648 = std::array<siamese::OriginalPacket,_64UL>::operator[]
                            ((array<siamese::OriginalPacket,_64UL> *)in_stack_fffffffffffff950,
                             CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948));
      local_64c = (local_648->Buffer).Bytes;
      local_650 = local_63c + *(int *)(in_RDI + 0x2c);
      local_651 = local_64c != 0;
      local_5a8 = &Logger;
      local_5b0 = "Lane ";
      puVar5 = local_624;
      local_5c0 = " sum ";
      puVar3 = &local_628;
      local_5d0 = " accumulating column: ";
      local_5d8 = &local_650;
      local_5e0 = ". Got = ";
      local_5e8 = &local_651;
      local_558 = &Logger;
      local_55c = 2;
      local_568 = "Lane ";
      local_578 = " sum ";
      local_588 = " accumulating column: ";
      local_598 = ". Got = ";
      local_548 = &Logger;
      local_54c = 2;
      local_5c8 = puVar3;
      local_5b8 = puVar5;
      local_5a0 = local_5e8;
      local_590 = local_5d8;
      local_580 = puVar3;
      local_570 = puVar5;
      if (DAT_0034fe10 < 3) {
        logger::LogStringBuffer::LogStringBuffer
                  ((LogStringBuffer *)in_stack_fffffffffffff950,
                   (char *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948),Trace);
        in_stack_fffffffffffff958 = (LogStringBuffer *)&Logger;
        std::operator<<(aoStack_520,(string *)&DAT_0034fe40);
        pcVar4 = " sum ";
        pcVar2 = " accumulating column: ";
        this_00 = in_stack_fffffffffffff958;
        std::operator<<(aoStack_520,"Lane ");
        buffer_00 = in_stack_fffffffffffff958;
        in_stack_fffffffffffffd40 = pcVar2;
        in_stack_fffffffffffffd48 = puVar3;
        in_stack_fffffffffffffd50 = pcVar4;
        std::ostream::operator<<(aoStack_520,*puVar5);
        std::operator<<(aoStack_520,pcVar4);
        std::ostream::operator<<(aoStack_520,*puVar3);
        std::operator<<(aoStack_520,pcVar2);
        std::ostream::operator<<(aoStack_520,local_650);
        std::operator<<(aoStack_520,". Got = ");
        pcVar2 = "false";
        if ((local_651 & 1) != 0) {
          pcVar2 = "true";
        }
        std::operator<<(aoStack_520,pcVar2);
        in_stack_fffffffffffff950 = (Allocator *)logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write((OutputWorker *)this_00,buffer_00);
        logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x244029);
        in_stack_fffffffffffffd58 = puVar5;
      }
      if (local_64c != 0) {
        if ((*(uint *)(local_638 + 0x10) < local_64c) &&
           (bVar1 = GrowingAlignedDataBuffer::GrowZeroPadded
                              ((GrowingAlignedDataBuffer *)in_stack_fffffffffffff958,
                               in_stack_fffffffffffff950,in_stack_fffffffffffff94c), !bVar1)) {
          *(undefined1 *)(in_RDI + 0x668) = 1;
          goto LAB_00244173;
        }
        if (local_628 == 0) {
          gf256_add_mem(in_stack_fffffffffffffb68,in_stack_fffffffffffffb60,
                        in_stack_fffffffffffffb5c);
        }
        else {
          local_5f0 = local_648->Column;
          if (local_628 == 2) {
            local_5e9 = (char)((ulong)(local_5f0 * 199) % 0xfd) + '\x03';
          }
          gf256_muladd_mem(in_stack_fffffffffffffd58,
                           (uint8_t)((ulong)in_stack_fffffffffffffd50 >> 0x38),
                           in_stack_fffffffffffffd48,(int)((ulong)in_stack_fffffffffffffd40 >> 0x20)
                          );
        }
      }
      local_63c = local_63c + 8;
    } while (local_63c < local_62c);
    *(uint *)(local_638 + 4) = local_63c;
  }
LAB_00244173:
  local_618 = (GrowingAlignedDataBuffer *)(local_638 + 8);
  return local_618;
}

Assistant:

const GrowingAlignedDataBuffer* DecoderPacketWindow::GetSum(unsigned laneIndex, unsigned sumIndex, unsigned elementEnd)
{
    DecoderSum& sum = Lanes[laneIndex].Sums[sumIndex];

    SIAMESE_DEBUG_ASSERT(sum.ElementStart <= sum.ElementEnd);
    SIAMESE_DEBUG_ASSERT((sum.ElementStart + ColumnStart) % kColumnLaneCount == laneIndex);
    SIAMESE_DEBUG_ASSERT((sum.ElementEnd + ColumnStart) % kColumnLaneCount == laneIndex);

    unsigned element = sum.ElementEnd;
    if (element >= elementEnd) {
        return &sum.Buffer;
    }

    // For each element to accumulate in this lane:
    do
    {
        SIAMESE_DEBUG_ASSERT((element + ColumnStart) % kColumnLaneCount == laneIndex);
        OriginalPacket* original     = GetWindowElement(element);
        const unsigned originalBytes = original->Buffer.Bytes;

        Logger.Info("Lane ", laneIndex,  " sum ",  sumIndex,  " accumulating column: ",  element + ColumnStart,  ". Got = ",  (originalBytes > 0));

        if (originalBytes > 0)
        {
            SIAMESE_DEBUG_ASSERT(original->Column % kColumnLaneCount == laneIndex);
            if (originalBytes > sum.Buffer.Bytes)
            {
                // Grow sum to encompass the original data
                if (!sum.Buffer.GrowZeroPadded(TheAllocator, originalBytes))
                {
                    EmergencyDisabled = true;
                    goto ExitSum;
                }
            }

            // Sum += PacketData
            if (sumIndex == 0)
                gf256_add_mem(sum.Buffer.Data, original->Buffer.Data, originalBytes);
            else
            {
                uint8_t CX = GetColumnValue(original->Column);
                if (sumIndex == 2)
                    CX = gf256_sqr(CX);

                // Sum += CX * PacketData
                gf256_muladd_mem(sum.Buffer.Data, CX, original->Buffer.Data, originalBytes);
            }
        }

        SIAMESE_DEBUG_ASSERT(original->Buffer.Bytes == 0 || original->Column % kColumnLaneCount == laneIndex);
        element += kColumnLaneCount;
    } while (element < elementEnd);

    SIAMESE_DEBUG_ASSERT((element + ColumnStart) % kColumnLaneCount == laneIndex);

    sum.ElementEnd = element;

ExitSum:
    return &sum.Buffer;
}